

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::InitPair
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  pointer pBVar5;
  reference this;
  short BgColor;
  short FgColor;
  const_iterator cStack_20;
  short PairNo;
  const_iterator Iterator;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  Iterator._M_node = (_List_node_base *)Args;
  sVar4 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(Args);
  if (sVar4 == 3) {
    cStack_20 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::cbegin
                          (Iterator._M_node);
    pBVar5 = std::_List_const_iterator<cvm::BasicValue>::operator->(&stack0xffffffffffffffe0);
    iVar1 = BasicValue::toInt(pBVar5);
    std::_List_const_iterator<cvm::BasicValue>::operator++(&stack0xffffffffffffffe0);
    pBVar5 = std::_List_const_iterator<cvm::BasicValue>::operator->(&stack0xffffffffffffffe0);
    iVar2 = BasicValue::toInt(pBVar5);
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::back
                     ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)Iterator._M_node);
    iVar3 = BasicValue::toInt(this);
    iVar1 = init_pair((int)(short)iVar1,(int)(short)iVar2,(int)(short)iVar3,(short)iVar1);
    BasicValue::BasicValue(__return_storage_ptr__,iVar1);
  }
  else {
    BasicValue::BasicValue(__return_storage_ptr__,-1);
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::InitPair(std::list<BasicValue> &Args) {
  if (Args.size() != 3)
    return ERR;

  auto Iterator = Args.cbegin();

  short PairNo = static_cast<short>(Iterator->toInt());
  ++Iterator;
  short FgColor = static_cast<short>(Iterator->toInt());
  short BgColor = static_cast<short>(Args.back().toInt());

  return ::init_pair(PairNo, FgColor, BgColor);
}